

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O3

void Rml::HSLAToRGBA(Array<float,_4> *vals)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if ((vals->_M_elems[1] != 0.0) || (NAN(vals->_M_elems[1]))) {
    fVar2 = fmodf(vals->_M_elems[0],360.0);
    fVar1 = vals->_M_elems[2];
    fVar4 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar2 |
                   (uint)(fVar2 + 360.0) & -(uint)(fVar2 < 0.0)) * 0.033333335;
    fVar2 = 1.0 - fVar1;
    if (fVar1 <= 1.0 - fVar1) {
      fVar2 = fVar1;
    }
    fVar5 = -fVar2 * vals->_M_elems[1];
    fVar3 = fmodf(fVar4 + 0.0,12.0);
    fVar2 = 9.0 - fVar3;
    if (fVar3 + -3.0 <= 9.0 - fVar3) {
      fVar2 = fVar3 + -3.0;
    }
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    if (fVar3 <= -1.0) {
      fVar3 = -1.0;
    }
    vals->_M_elems[0] = fVar3 * fVar5 + fVar1;
    fVar3 = fmodf(fVar4 + 8.0,12.0);
    fVar2 = 9.0 - fVar3;
    if (fVar3 + -3.0 <= 9.0 - fVar3) {
      fVar2 = fVar3 + -3.0;
    }
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    if (fVar3 <= -1.0) {
      fVar3 = -1.0;
    }
    vals->_M_elems[1] = fVar3 * fVar5 + fVar1;
    fVar4 = fmodf(fVar4 + 4.0,12.0);
    fVar2 = 9.0 - fVar4;
    if (fVar4 + -3.0 <= 9.0 - fVar4) {
      fVar2 = fVar4 + -3.0;
    }
    fVar4 = 1.0;
    if (fVar2 <= 1.0) {
      fVar4 = fVar2;
    }
    if (fVar4 <= -1.0) {
      fVar4 = -1.0;
    }
    vals->_M_elems[2] = fVar4 * fVar5 + fVar1;
  }
  else {
    vals->_M_elems[1] = vals->_M_elems[2];
    vals->_M_elems[0] = vals->_M_elems[2];
  }
  return;
}

Assistant:

static void HSLAToRGBA(Array<float, 4>& vals)
{
	if (vals[1] == 0.0f)
	{
		vals[0] = vals[1] = vals[2];
	}
	else
	{
		float h = std::fmod(vals[0], 360.0f);
		if (h < 0)
			h += 360.0f;
		float s = vals[1];
		float l = vals[2];
		vals[0] = HSL_f(h, s, l, 0.0f);
		vals[1] = HSL_f(h, s, l, 8.0f);
		vals[2] = HSL_f(h, s, l, 4.0f);
	}
}